

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::Accumulate
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  bool bVar1;
  FunctionTableHolder *pFVar2;
  reference puVar3;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  ImageManager manager;
  AccumulateForm2 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  AccumulateForm2 func;
  ImageTypeManager *registrator;
  ImageTypeManager *in_stack_fffffffffffffef8;
  uint8_t requiredType;
  FunctionTableHolder *in_stack_ffffffffffffff00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff10;
  ImageManager *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  ImageTypeManager *in_stack_ffffffffffffff40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  uint8_t local_31;
  AccumulateForm2 local_30;
  ImageTypeManager *local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  
  local_20 = in_R9;
  local_28 = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar2 = ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  local_30 = pFVar2->Accumulate;
  local_31 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_30 == (AccumulateForm2)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(local_28), bVar1)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    local_40 = local_58;
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffef8);
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8)
      ;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffff00,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffef8);
      if (!bVar1) break;
      in_stack_fffffffffffffef8 = local_28;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_60);
      in_stack_ffffffffffffff00 =
           ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      if (in_stack_ffffffffffffff00->Accumulate != (AccumulateForm2)0x0) {
        local_30 = in_stack_ffffffffffffff00->Accumulate;
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_60);
        local_31 = *puVar3;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_60);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff10);
  }
  requiredType = (uint8_t)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              *)CONCAT44(in_ESI,in_EDX),(char *)CONCAT44(in_ECX,in_R8D));
  anon_unknown.dwarf_9a3be::ImageManager::ImageManager
            ((ImageManager *)in_stack_ffffffffffffff00,requiredType);
  (*local_30)(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,local_20);
  anon_unknown.dwarf_9a3be::ImageManager::~ImageManager(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void Accumulate( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector < uint32_t > & result )
    {
        initialize( image, Accumulate )
        func( image, x, y, width, height, result );
    }